

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

_Bool cf_socket_conn_is_alive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  char *fmt;
  _Bool _Var4;
  pollfd pfd [1];
  
  pvVar1 = cf->ctx;
  *input_pending = false;
  if ((pvVar1 == (void *)0x0) || (pfd[0].fd = *(int *)((long)pvVar1 + 0x98), pfd[0].fd == -1)) {
    return false;
  }
  pfd[0].events = 0xc3;
  pfd[0].revents = 0;
  iVar3 = Curl_poll(pfd,1,0);
  if (iVar3 < 0) {
    if (data == (Curl_easy *)0x0) {
      return false;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return false;
    }
    pcVar2 = (data->state).feat;
    if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
      return false;
    }
    if (cf->cft->log_level < 1) {
      return false;
    }
    fmt = "is_alive: poll error, assume dead";
  }
  else {
    if (iVar3 == 0) {
      _Var4 = true;
      if (data == (Curl_easy *)0x0) {
        return true;
      }
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return true;
      }
      pcVar2 = (data->state).feat;
      if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
        return true;
      }
      if (cf->cft->log_level < 1) {
        return true;
      }
      fmt = "is_alive: poll timeout, assume alive";
      goto LAB_00115f16;
    }
    if (((ulong)pfd[0] & 0x3a000000000000) == 0) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"is_alive: valid events, looks alive");
      }
      *input_pending = true;
      return true;
    }
    if (data == (Curl_easy *)0x0) {
      return false;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return false;
    }
    pcVar2 = (data->state).feat;
    if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
      return false;
    }
    if (cf->cft->log_level < 1) {
      return false;
    }
    fmt = "is_alive: err/hup/etc events, assume dead";
  }
  _Var4 = false;
LAB_00115f16:
  Curl_trc_cf_infof(data,cf,fmt);
  return _Var4;
}

Assistant:

static bool cf_socket_conn_is_alive(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool *input_pending)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  struct pollfd pfd[1];
  int r;

  *input_pending = FALSE;
  (void)data;
  if(!ctx || ctx->sock == CURL_SOCKET_BAD)
    return FALSE;

  /* Check with 0 timeout if there are any events pending on the socket */
  pfd[0].fd = ctx->sock;
  pfd[0].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
  pfd[0].revents = 0;

  r = Curl_poll(pfd, 1, 0);
  if(r < 0) {
    CURL_TRC_CF(data, cf, "is_alive: poll error, assume dead");
    return FALSE;
  }
  else if(r == 0) {
    CURL_TRC_CF(data, cf, "is_alive: poll timeout, assume alive");
    return TRUE;
  }
  else if(pfd[0].revents & (POLLERR|POLLHUP|POLLPRI|POLLNVAL)) {
    CURL_TRC_CF(data, cf, "is_alive: err/hup/etc events, assume dead");
    return FALSE;
  }

  CURL_TRC_CF(data, cf, "is_alive: valid events, looks alive");
  *input_pending = TRUE;
  return TRUE;
}